

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ProgramUniformTests::init(ProgramUniformTests *this,EVP_PKEY_CTX *ctx)

{
  Feature additionalFeatures;
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  UniformCollection *pUVar7;
  TestCaseGroup *pTVar8;
  char *pcVar9;
  TestCaseGroup *pTVar10;
  size_type sVar11;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection> *pSVar12;
  UniformAssignCase *pUVar13;
  UniformCollectionGroup *local_8f8;
  char *local_850;
  uint local_844;
  bool local_83e;
  bool local_83b;
  bool local_83a;
  DataType local_760;
  DataType local_75c;
  UniformCollectionGroup *local_6f8;
  undefined1 local_6f0 [8];
  string name_3;
  int shaderType_2;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
  *uniformCollection_2;
  string collName_2;
  UniformCollectionCase *collectionCase_2;
  int collectionNdx_2;
  UniformCollectionGroup *collectionGroup_2;
  TestCaseGroup *unusedUniformsGroup;
  string name_2;
  int shaderType_1;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
  *uniformCollection_1;
  string collName_1;
  UniformCollectionCase *collectionCase_1;
  int collectionNdx_1;
  TestCaseGroup *collectionTestGroup_1;
  UniformCollectionGroup *collectionGroup_1;
  int collectionGroupNdx_1;
  TestCaseGroup *curArrayAssignGroup;
  char *groupDesc;
  char *groupName;
  int local_5e8;
  Feature arrayAssignMode;
  int arrayAssignGroupNdx;
  deUint32 arrayFirstElemNameNoIndexFeat;
  string name_1;
  undefined1 local_5b8 [4];
  int shaderType;
  string nameWithMatrixType;
  int matrixTypeI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  undefined1 local_550 [8];
  string nameWithBoolType;
  char *booleanTypeName;
  int local_520;
  deUint32 booleanTypeFeat;
  int booleanTypeI;
  int numMatVariations;
  bool varyMatrixMode;
  bool containsMatrices;
  int numBoolVariations;
  bool varyBoolApiType;
  bool containsBooleans;
  SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
  *uniformCollection;
  string collName;
  UniformCollectionCase *collectionCase;
  TestCaseGroup *pTStack_4d0;
  int collectionNdx;
  TestCaseGroup *collectionTestGroup;
  string collectionGroupName;
  UniformCollectionGroup *collectionGroup;
  int referToFirstArrayElemWithoutIndexI;
  int numArrayFirstElemNameCases;
  int collectionGroupNdx;
  TestCaseGroup *checkMethodGroup;
  CheckMethod checkMethod;
  int checkMethodI;
  TestCaseGroup *assignMethodGroup;
  AssignMethod assignMethod;
  int assignMethodI;
  UniformCollectionCase local_440;
  UniformCollectionCase local_410;
  UniformCollectionCase local_3e0;
  UniformCollectionCase local_3b0;
  UniformCollectionCase local_380;
  UniformCollectionCase local_350;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [8];
  string name;
  char *secondTypeName;
  undefined1 local_288 [4];
  DataType secondDataType;
  UniformCollectionCase local_258;
  char *local_228;
  char *typeName;
  int local_218;
  DataType dataType;
  int dataTypeNdx;
  undefined1 local_208 [8];
  UniformCollectionGroup defaultUniformCollections [9];
  ProgramUniformTests *this_local;
  
  local_6f8 = (UniformCollectionGroup *)local_208;
  defaultUniformCollections[8].cases.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  do {
    init::UniformCollectionGroup::UniformCollectionGroup(local_6f8);
    local_6f8 = local_6f8 + 1;
  } while (local_6f8 !=
           (UniformCollectionGroup *)
           &defaultUniformCollections[8].cases.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator=((string *)local_208,"basic");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[0].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"basic_array");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[1].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"basic_struct");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[2].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"struct_in_array");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[3].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"array_in_struct");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[4].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"nested_structs_arrays");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[5].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"multiple_basic");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[6].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"multiple_basic_array");
  std::__cxx11::string::operator=
            ((string *)
             &defaultUniformCollections[7].cases.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"multiple_nested_structs_arrays");
  for (local_218 = 0; local_218 < 0x1b; local_218 = local_218 + 1) {
    typeName._4_4_ = *(DataType *)(s_testDataTypes + (long)local_218 * 4);
    pcVar6 = glu::getDataTypeName(typeName._4_4_);
    local_228 = pcVar6;
    pUVar7 = anon_unknown_1::UniformCollection::basic(typeName._4_4_,"");
    anon_unknown_1::UniformCollectionCase::UniformCollectionCase(&local_258,pcVar6,pUVar7);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                 *)((long)&defaultUniformCollections[0].name.field_2 + 8),&local_258);
    anon_unknown_1::UniformCollectionCase::~UniformCollectionCase(&local_258);
    bVar2 = glu::isDataTypeScalar(typeName._4_4_);
    if ((bVar2) ||
       ((((bVar2 = glu::isDataTypeVector(typeName._4_4_), bVar2 &&
          (iVar3 = glu::getDataTypeScalarSize(typeName._4_4_), iVar3 == 4)) ||
         (typeName._4_4_ == TYPE_FLOAT_MAT4)) || (typeName._4_4_ == TYPE_SAMPLER_2D)))) {
      pcVar6 = local_228;
      pUVar7 = anon_unknown_1::UniformCollection::basicArray(typeName._4_4_,"");
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)local_288,pcVar6,pUVar7);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                   *)((long)&defaultUniformCollections[1].name.field_2 + 8),(value_type *)local_288)
      ;
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)local_288);
    }
    bVar2 = glu::isDataTypeScalar(typeName._4_4_);
    if (((bVar2) || (typeName._4_4_ == TYPE_FLOAT_MAT4)) || (typeName._4_4_ == TYPE_SAMPLER_2D)) {
      bVar2 = glu::isDataTypeScalar(typeName._4_4_);
      if (bVar2) {
        local_75c = glu::getDataTypeVector(typeName._4_4_,4);
      }
      else {
        if (typeName._4_4_ == TYPE_FLOAT_MAT4) {
          local_760 = TYPE_FLOAT_MAT2;
        }
        else {
          local_760 = TYPE_LAST;
          if (typeName._4_4_ == TYPE_SAMPLER_2D) {
            local_760 = TYPE_SAMPLER_CUBE;
          }
        }
        local_75c = local_760;
      }
      name.field_2._8_8_ = glu::getDataTypeName(local_75c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"",&local_319);
      std::operator+(&local_2f8,&local_318,local_228);
      std::operator+(&local_2d8,&local_2f8,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                     &local_2d8,(char *)name.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator(&local_319);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pUVar7 = anon_unknown_1::UniformCollection::basicStruct(typeName._4_4_,local_75c,false,"");
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase(&local_350,pcVar6,pUVar7);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                   *)((long)&defaultUniformCollections[2].name.field_2 + 8),&local_350);
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase(&local_350);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pUVar7 = anon_unknown_1::UniformCollection::basicStruct(typeName._4_4_,local_75c,true,"");
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase(&local_380,pcVar6,pUVar7);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                   *)((long)&defaultUniformCollections[4].name.field_2 + 8),&local_380);
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase(&local_380);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pUVar7 = anon_unknown_1::UniformCollection::structInArray(typeName._4_4_,local_75c,false,"");
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase(&local_3b0,pcVar6,pUVar7);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                   *)((long)&defaultUniformCollections[3].name.field_2 + 8),&local_3b0);
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase(&local_3b0);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pUVar7 = anon_unknown_1::UniformCollection::nestedArraysStructs(typeName._4_4_,local_75c,"");
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase(&local_3e0,pcVar6,pUVar7);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                   *)((long)&defaultUniformCollections[5].name.field_2 + 8),&local_3e0);
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase(&local_3e0);
      std::__cxx11::string::~string((string *)local_2b8);
    }
  }
  pUVar7 = anon_unknown_1::UniformCollection::multipleBasic("");
  anon_unknown_1::UniformCollectionCase::UniformCollectionCase(&local_410,(char *)0x0,pUVar7);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
  ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
               *)((long)&defaultUniformCollections[6].name.field_2 + 8),&local_410);
  anon_unknown_1::UniformCollectionCase::~UniformCollectionCase(&local_410);
  pUVar7 = anon_unknown_1::UniformCollection::multipleBasicArray("");
  anon_unknown_1::UniformCollectionCase::UniformCollectionCase(&local_440,(char *)0x0,pUVar7);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
  ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
               *)((long)&defaultUniformCollections[7].name.field_2 + 8),&local_440);
  anon_unknown_1::UniformCollectionCase::~UniformCollectionCase(&local_440);
  pUVar7 = anon_unknown_1::UniformCollection::multipleNestedArraysStructs("");
  anon_unknown_1::UniformCollectionCase::UniformCollectionCase
            ((UniformCollectionCase *)&assignMethod,(char *)0x0,pUVar7);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
  ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
               *)((long)&defaultUniformCollections[8].name.field_2 + 8),(value_type *)&assignMethod)
  ;
  anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
            ((UniformCollectionCase *)&assignMethod);
  for (assignMethodGroup._4_4_ = ASSIGNMETHOD_POINTER; (int)assignMethodGroup._4_4_ < 2;
      assignMethodGroup._4_4_ = assignMethodGroup._4_4_ + ASSIGNMETHOD_VALUE) {
    pTVar8 = (TestCaseGroup *)operator_new(0x78);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar6 = UniformAssignCase::getAssignMethodName(assignMethodGroup._4_4_);
    pcVar9 = UniformAssignCase::getAssignMethodDescription(assignMethodGroup._4_4_);
    TestCaseGroup::TestCaseGroup(pTVar8,pCVar1,pcVar6,pcVar9);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar8);
    for (checkMethodGroup._4_4_ = CHECKMETHOD_GET_UNIFORM; (int)checkMethodGroup._4_4_ < 2;
        checkMethodGroup._4_4_ = checkMethodGroup._4_4_ + CHECKMETHOD_RENDER) {
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar6 = UniformAssignCase::getCheckMethodName(checkMethodGroup._4_4_);
      pcVar9 = UniformAssignCase::getCheckMethodDescription(checkMethodGroup._4_4_);
      TestCaseGroup::TestCaseGroup(pTVar10,pCVar1,pcVar6,pcVar9);
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pTVar10);
      for (referToFirstArrayElemWithoutIndexI = 0; referToFirstArrayElemWithoutIndexI < 9;
          referToFirstArrayElemWithoutIndexI = referToFirstArrayElemWithoutIndexI + 1) {
        iVar3 = 1;
        if (checkMethodGroup._4_4_ == CHECKMETHOD_GET_UNIFORM &&
            referToFirstArrayElemWithoutIndexI == 1) {
          iVar3 = 2;
        }
        for (collectionGroup._4_4_ = 0; collectionGroup._4_4_ < iVar3;
            collectionGroup._4_4_ = collectionGroup._4_4_ + 1) {
          collectionGroupName.field_2._8_8_ =
               &defaultUniformCollections[(long)referToFirstArrayElemWithoutIndexI + -1].cases.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pcVar6 = "_first_elem_without_brackets";
          if (collectionGroup._4_4_ == 0) {
            pcVar6 = "";
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &collectionTestGroup,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         collectionGroupName.field_2._8_8_,pcVar6);
          pTStack_4d0 = (TestCaseGroup *)0x0;
          for (collectionCase._4_4_ = 0;
              sVar11 = std::
                       vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                       ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                               *)(collectionGroupName.field_2._8_8_ + 0x20)),
              collectionCase._4_4_ < (int)sVar11; collectionCase._4_4_ = collectionCase._4_4_ + 1) {
            collName.field_2._8_8_ =
                 std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                 ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                               *)(collectionGroupName.field_2._8_8_ + 0x20),
                              (long)collectionCase._4_4_);
            std::__cxx11::string::string
                      ((string *)&uniformCollection,(string *)collName.field_2._8_8_);
            pSVar12 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                       *)(collName.field_2._8_8_ + 0x20);
            pUVar7 = de::
                     SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                     ::operator->(pSVar12);
            bVar2 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                              (pUVar7,glu::isDataTypeBoolOrBVec);
            local_83a = false;
            if ((checkMethodGroup._4_4_ == CHECKMETHOD_GET_UNIFORM) && (local_83a = false, bVar2)) {
              local_83b = (uint)referToFirstArrayElemWithoutIndexI < 2;
              local_83a = local_83b;
            }
            pUVar7 = de::
                     SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                     ::operator->(pSVar12);
            bVar2 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                              (pUVar7,glu::isDataTypeMatrix);
            local_83e = false;
            if (bVar2) {
              local_83e = (uint)referToFirstArrayElemWithoutIndexI < 2;
            }
            iVar4 = 1;
            if (local_83e) {
              iVar4 = 2;
            }
            if ((!bVar2) || (assignMethodGroup._4_4_ == ASSIGNMETHOD_POINTER)) {
              for (local_520 = 0; local_520 < (int)((uint)local_83a * 2 + 1);
                  local_520 = local_520 + 1) {
                if (local_520 == 1) {
                  local_844 = 0x40;
                }
                else {
                  local_844 = 0;
                  if (local_520 == 2) {
                    local_844 = 0x80;
                  }
                }
                if (local_520 == 1) {
                  local_850 = "int";
                }
                else {
                  local_850 = "float";
                  if (local_520 == 2) {
                    local_850 = "uint";
                  }
                }
                nameWithBoolType.field_2._8_8_ = local_850;
                nameWithMatrixType.field_2._M_local_buf[0xf] = '\0';
                nameWithMatrixType.field_2._M_local_buf[0xe] = '\0';
                if (local_83a == false) {
                  std::__cxx11::string::string((string *)local_550,(string *)&uniformCollection);
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&matrixTypeI,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&uniformCollection,"api_");
                  nameWithMatrixType.field_2._M_local_buf[0xf] = '\x01';
                  std::operator+(&local_570,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&matrixTypeI,(char *)nameWithBoolType.field_2._8_8_);
                  nameWithMatrixType.field_2._M_local_buf[0xe] = '\x01';
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_550,&local_570,"_");
                }
                if ((nameWithMatrixType.field_2._M_local_buf[0xe] & 1U) != 0) {
                  std::__cxx11::string::~string((string *)&local_570);
                }
                if ((nameWithMatrixType.field_2._M_local_buf[0xf] & 1U) != 0) {
                  std::__cxx11::string::~string((string *)&matrixTypeI);
                }
                for (nameWithMatrixType.field_2._8_4_ = 0;
                    (int)nameWithMatrixType.field_2._8_4_ < iVar4;
                    nameWithMatrixType.field_2._8_4_ = nameWithMatrixType.field_2._8_4_ + 1) {
                  pcVar6 = "";
                  if (nameWithMatrixType.field_2._8_4_ == 1) {
                    pcVar6 = "row_major_";
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_5b8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_550,pcVar6);
                  for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
                      name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
                    pcVar6 = getCaseShaderTypeName(name_1.field_2._12_4_);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&arrayAssignGroupNdx,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_5b8,pcVar6);
                    uVar5 = 0x100;
                    if (collectionGroup._4_4_ == 0) {
                      uVar5 = 0;
                    }
                    if (pTStack_4d0 == (TestCaseGroup *)0x0) {
                      pTStack_4d0 = (TestCaseGroup *)operator_new(0x78);
                      pCVar1 = (this->super_TestCaseGroup).m_context;
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      TestCaseGroup::TestCaseGroup(pTStack_4d0,pCVar1,pcVar6,"");
                      tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pTStack_4d0);
                    }
                    pUVar13 = (UniformAssignCase *)operator_new(0xf8);
                    pCVar1 = (this->super_TestCaseGroup).m_context;
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    UniformAssignCase::UniformAssignCase
                              (pUVar13,pCVar1,pcVar6,"",name_1.field_2._12_4_,pSVar12,
                               checkMethodGroup._4_4_,assignMethodGroup._4_4_,
                               local_844 | uVar5 |
                               (uint)(nameWithMatrixType.field_2._8_4_ == 1) << 2);
                    tcu::TestNode::addChild((TestNode *)pTStack_4d0,(TestNode *)pUVar13);
                    std::__cxx11::string::~string((string *)&arrayAssignGroupNdx);
                  }
                  std::__cxx11::string::~string((string *)local_5b8);
                }
                std::__cxx11::string::~string((string *)local_550);
              }
            }
            std::__cxx11::string::~string((string *)&uniformCollection);
          }
          std::__cxx11::string::~string((string *)&collectionTestGroup);
        }
      }
    }
  }
  for (local_5e8 = 0; local_5e8 < 2; local_5e8 = local_5e8 + 1) {
    additionalFeatures = init::arrayAssignGroups[local_5e8].arrayAssignMode;
    pcVar6 = init::arrayAssignGroups[local_5e8].name;
    pcVar9 = init::arrayAssignGroups[local_5e8].description;
    pTVar8 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup(pTVar8,(this->super_TestCaseGroup).m_context,pcVar6,pcVar9);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar8);
    for (collectionGroup_1._4_4_ = 0; collectionGroup_1._4_4_ < 3;
        collectionGroup_1._4_4_ = collectionGroup_1._4_4_ + 1) {
      iVar3 = init::basicArrayCollectionGroups[collectionGroup_1._4_4_];
      pTVar10 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      TestCaseGroup::TestCaseGroup(pTVar10,pCVar1,pcVar6,"");
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pTVar10);
      for (collectionCase_1._4_4_ = 0;
          sVar11 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                   ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                           *)((long)&defaultUniformCollections[iVar3].name.field_2 + 8)),
          collectionCase_1._4_4_ < (int)sVar11; collectionCase_1._4_4_ = collectionCase_1._4_4_ + 1)
      {
        collName_1.field_2._8_8_ =
             std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                           *)((long)&defaultUniformCollections[iVar3].name.field_2 + 8),
                          (long)collectionCase_1._4_4_);
        std::__cxx11::string::string
                  ((string *)&uniformCollection_1,(string *)collName_1.field_2._8_8_);
        pSVar12 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                   *)(collName_1.field_2._8_8_ + 0x20);
        for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 3;
            name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
          pcVar6 = getCaseShaderTypeName(name_2.field_2._12_4_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &unusedUniformsGroup,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &uniformCollection_1,pcVar6);
          pUVar13 = (UniformAssignCase *)operator_new(0xf8);
          pCVar1 = (this->super_TestCaseGroup).m_context;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          UniformAssignCase::UniformAssignCase
                    (pUVar13,pCVar1,pcVar6,"",name_2.field_2._12_4_,pSVar12,CHECKMETHOD_GET_UNIFORM,
                     ASSIGNMETHOD_POINTER,additionalFeatures);
          tcu::TestNode::addChild((TestNode *)pTVar10,(TestNode *)pUVar13);
          std::__cxx11::string::~string((string *)&unusedUniformsGroup);
        }
        std::__cxx11::string::~string((string *)&uniformCollection_1);
      }
    }
  }
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar8,(this->super_TestCaseGroup).m_context,"unused_uniforms",
             "Test with unused uniforms");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar8);
  for (collectionCase_2._4_4_ = 0;
      sVar11 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
               ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                       *)((long)&defaultUniformCollections[4].name.field_2 + 8)),
      collectionCase_2._4_4_ < (int)sVar11; collectionCase_2._4_4_ = collectionCase_2._4_4_ + 1) {
    collName_2.field_2._8_8_ =
         std::
         vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
         ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                       *)((long)&defaultUniformCollections[4].name.field_2 + 8),
                      (long)collectionCase_2._4_4_);
    std::__cxx11::string::string((string *)&uniformCollection_2,(string *)collName_2.field_2._8_8_);
    pSVar12 = (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection> *
              )(collName_2.field_2._8_8_ + 0x20);
    for (name_3.field_2._12_4_ = 0; (int)name_3.field_2._12_4_ < 3;
        name_3.field_2._12_4_ = name_3.field_2._12_4_ + 1) {
      pcVar6 = getCaseShaderTypeName(name_3.field_2._12_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &uniformCollection_2,pcVar6);
      pUVar13 = (UniformAssignCase *)operator_new(0xf8);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      UniformAssignCase::UniformAssignCase
                (pUVar13,pCVar1,pcVar6,"",name_3.field_2._12_4_,pSVar12,CHECKMETHOD_GET_UNIFORM,
                 ASSIGNMETHOD_POINTER,0x21);
      tcu::TestNode::addChild((TestNode *)pTVar8,(TestNode *)pUVar13);
      std::__cxx11::string::~string((string *)local_6f0);
    }
    std::__cxx11::string::~string((string *)&uniformCollection_2);
  }
  local_8f8 = (UniformCollectionGroup *)
              &defaultUniformCollections[8].cases.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_8f8 = local_8f8 + -1;
    init::UniformCollectionGroup::~UniformCollectionGroup(local_8f8);
  } while (local_8f8 != (UniformCollectionGroup *)local_208);
  return (int)local_8f8;
}

Assistant:

void ProgramUniformTests::init (void)
{
	// Generate sets of UniformCollections that are used by several cases.

	enum
	{
		UNIFORMCOLLECTIONS_BASIC = 0,
		UNIFORMCOLLECTIONS_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_BASIC_STRUCT,
		UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY,
		UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT,
		UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS,

		UNIFORMCOLLECTIONS_LAST
	};

	struct UniformCollectionGroup
	{
		string							name;
		vector<UniformCollectionCase>	cases;
	} defaultUniformCollections[UNIFORMCOLLECTIONS_LAST];

	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].name							= "basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].name						= "basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].name						= "basic_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].name					= "struct_in_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].name					= "array_in_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].name			= "nested_structs_arrays";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].name					= "multiple_basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].name				= "multiple_basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].name	= "multiple_nested_structs_arrays";

	for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_testDataTypes); dataTypeNdx++)
	{
		const glu::DataType		dataType	= s_testDataTypes[dataTypeNdx];
		const char* const		typeName	= glu::getDataTypeName(dataType);

		defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basic(dataType)));

		if (glu::isDataTypeScalar(dataType)													||
			(glu::isDataTypeVector(dataType) && glu::getDataTypeScalarSize(dataType) == 4)	||
			dataType == glu::TYPE_FLOAT_MAT4												||
			dataType == glu::TYPE_SAMPLER_2D)
			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basicArray(dataType)));

		if (glu::isDataTypeScalar(dataType)		||
			dataType == glu::TYPE_FLOAT_MAT4	||
			dataType == glu::TYPE_SAMPLER_2D)
		{
			const glu::DataType		secondDataType	= glu::isDataTypeScalar(dataType)	? glu::getDataTypeVector(dataType, 4)
													: dataType == glu::TYPE_FLOAT_MAT4	? glu::TYPE_FLOAT_MAT2
													: dataType == glu::TYPE_SAMPLER_2D	? glu::TYPE_SAMPLER_CUBE
													: glu::TYPE_LAST;
			DE_ASSERT(secondDataType != glu::TYPE_LAST);
			const char* const		secondTypeName	= glu::getDataTypeName(secondDataType);
			const string			name			= string("") + typeName + "_" + secondTypeName;

			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].cases.push_back			(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, true)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::structInArray(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(name.c_str(), UniformCollection::nestedArraysStructs(dataType, secondDataType)));
		}
	}
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].cases.push_back					(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasic()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].cases.push_back				(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasicArray()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(DE_NULL, UniformCollection::multipleNestedArraysStructs()));

	// Basic by-pointer or by-value uniform assignment cases.

	for (int assignMethodI = 0; assignMethodI < (int)UniformAssignCase::ASSIGNMETHOD_LAST; assignMethodI++)
	{
		const UniformAssignCase::AssignMethod	assignMethod		= (UniformAssignCase::AssignMethod)assignMethodI;
		TestCaseGroup* const					assignMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getAssignMethodName(assignMethod), UniformAssignCase::getAssignMethodDescription(assignMethod));
		addChild(assignMethodGroup);

		for (int checkMethodI = 0; checkMethodI < (int)UniformAssignCase::CHECKMETHOD_LAST; checkMethodI++)
		{
			const UniformAssignCase::CheckMethod	checkMethod			= (UniformAssignCase::CheckMethod)checkMethodI;
			TestCaseGroup* const					checkMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getCheckMethodName(checkMethod), UniformAssignCase::getCheckMethodDescription(checkMethod));
			assignMethodGroup->addChild(checkMethodGroup);

			for (int collectionGroupNdx = 0; collectionGroupNdx < (int)UNIFORMCOLLECTIONS_LAST; collectionGroupNdx++)
			{
				const int numArrayFirstElemNameCases = checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY ? 2 : 1;

				for (int referToFirstArrayElemWithoutIndexI = 0; referToFirstArrayElemWithoutIndexI < numArrayFirstElemNameCases; referToFirstArrayElemWithoutIndexI++)
				{
					const UniformCollectionGroup&	collectionGroup			= defaultUniformCollections[collectionGroupNdx];
					const string					collectionGroupName		= collectionGroup.name + (referToFirstArrayElemWithoutIndexI == 0 ? "" : "_first_elem_without_brackets");
					TestCaseGroup*					collectionTestGroup		= DE_NULL;

					for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
					{
						const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
						const string								collName			= collectionCase.namePrefix;
						const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;
						const bool									containsBooleans	= uniformCollection->containsMatchingBasicType(glu::isDataTypeBoolOrBVec);
						const bool									varyBoolApiType		= checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && containsBooleans &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numBoolVariations	= varyBoolApiType ? 3 : 1;
						const bool									containsMatrices	= uniformCollection->containsMatchingBasicType(glu::isDataTypeMatrix);
						const bool									varyMatrixMode		= containsMatrices &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numMatVariations	= varyMatrixMode ? 2 : 1;

						if (containsMatrices && assignMethod != UniformAssignCase::ASSIGNMETHOD_POINTER)
							continue;

						for (int booleanTypeI = 0; booleanTypeI < numBoolVariations; booleanTypeI++)
						{
							const deUint32		booleanTypeFeat		= booleanTypeI == 1 ? UniformCase::FEATURE_BOOLEANAPITYPE_INT
																	: booleanTypeI == 2 ? UniformCase::FEATURE_BOOLEANAPITYPE_UINT
																	: 0;
							const char* const	booleanTypeName		= booleanTypeI == 1 ? "int"
																	: booleanTypeI == 2 ? "uint"
																	: "float";
							const string		nameWithBoolType	= varyBoolApiType ? collName + "api_" + booleanTypeName + "_" : collName;

							for (int matrixTypeI = 0; matrixTypeI < numMatVariations; matrixTypeI++)
							{
								const string nameWithMatrixType = nameWithBoolType + (matrixTypeI == 1 ? "row_major_" : "");

								for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
								{
									const string	name							= nameWithMatrixType + getCaseShaderTypeName((CaseShaderType)shaderType);
									const deUint32	arrayFirstElemNameNoIndexFeat	= referToFirstArrayElemWithoutIndexI == 0 ? 0 : UniformCase::FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX;

									// skip empty groups by creating groups on demand
									if (!collectionTestGroup)
									{
										collectionTestGroup = new TestCaseGroup(m_context, collectionGroupName.c_str(), "");
										checkMethodGroup->addChild(collectionTestGroup);
									}

									collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																						checkMethod, assignMethod,
																						booleanTypeFeat | arrayFirstElemNameNoIndexFeat | (matrixTypeI == 1 ? UniformCase::FEATURE_MATRIXMODE_ROWMAJOR : 0)));
								}
							}
						}
					}
				}
			}
		}
	}

	// Cases that assign multiple basic-array elements with one glProgramUniform*v() (i.e. the count parameter is bigger than 1).

	{
		static const struct
		{
			UniformCase::Feature	arrayAssignMode;
			const char*				name;
			const char*				description;
		} arrayAssignGroups[] =
		{
			{ UniformCase::FEATURE_ARRAYASSIGN_FULL,			"basic_array_assign_full",		"Assign entire basic-type arrays per glProgramUniform*v() call"				},
			{ UniformCase::FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO,	"basic_array_assign_partial",	"Assign two elements of a basic-type array per glProgramUniform*v() call"	}
		};

		for (int arrayAssignGroupNdx = 0; arrayAssignGroupNdx < DE_LENGTH_OF_ARRAY(arrayAssignGroups); arrayAssignGroupNdx++)
		{
			UniformCase::Feature	arrayAssignMode		= arrayAssignGroups[arrayAssignGroupNdx].arrayAssignMode;
			const char* const		groupName			= arrayAssignGroups[arrayAssignGroupNdx].name;
			const char* const		groupDesc			= arrayAssignGroups[arrayAssignGroupNdx].description;

			TestCaseGroup* const curArrayAssignGroup = new TestCaseGroup(m_context, groupName, groupDesc);
			addChild(curArrayAssignGroup);

			static const int basicArrayCollectionGroups[] = { UNIFORMCOLLECTIONS_BASIC_ARRAY, UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT, UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY };

			for (int collectionGroupNdx = 0; collectionGroupNdx < DE_LENGTH_OF_ARRAY(basicArrayCollectionGroups); collectionGroupNdx++)
			{
				const UniformCollectionGroup&	collectionGroup		= defaultUniformCollections[basicArrayCollectionGroups[collectionGroupNdx]];
				TestCaseGroup* const			collectionTestGroup	= new TestCaseGroup(m_context, collectionGroup.name.c_str(), "");
				curArrayAssignGroup->addChild(collectionTestGroup);

				for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
				{
					const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
					const string								collName			= collectionCase.namePrefix;
					const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

					for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
					{
						const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
						collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																			UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																			arrayAssignMode));
					}
				}
			}
		}
	}

	// Cases with unused uniforms.

	{
		TestCaseGroup* const unusedUniformsGroup = new TestCaseGroup(m_context, "unused_uniforms", "Test with unused uniforms");
		addChild(unusedUniformsGroup);

		const UniformCollectionGroup& collectionGroup = defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT];

		for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
		{
			const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
			const string								collName			= collectionCase.namePrefix;
			const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

			for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
			{
				const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
				unusedUniformsGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																	UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																	UniformCase::FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX | UniformCase::FEATURE_UNIFORMUSAGE_EVERY_OTHER));
			}
		}
	}
}